

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O3

ON_wString __thiscall
ON_wString::RemoveSuffix(ON_wString *this,wchar_t *suffix,ON_Locale *locale,bool bIgnoreCase)

{
  int iVar1;
  wchar_t *pwVar2;
  bool bVar3;
  int element_count1;
  undefined7 in_register_00000009;
  long lVar4;
  int size;
  bool in_R8B;
  ON_Internal_Empty_wString *pOVar5;
  wchar_t *s;
  
  pwVar2 = *(wchar_t **)suffix;
  s = pwVar2;
  if (pwVar2 == &empty_wstring.s) {
    s = L"";
  }
  if (pwVar2 == (wchar_t *)0x0) {
    s = L"";
  }
  if (locale != (ON_Locale *)0x0) {
    lVar4 = 0;
    do {
      if (*(int *)(locale->m_bcp47_language_tag + lVar4 * 4 + -0x10) == 0) goto LAB_0067330a;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x7ffffffd);
    lVar4 = 0x7ffffffd;
LAB_0067330a:
    pOVar5 = (ON_Internal_Empty_wString *)(pwVar2 + -3);
    if (pwVar2 == (wchar_t *)0x0) {
      pOVar5 = &empty_wstring;
    }
    element_count1 = (int)lVar4;
    if (((0 < element_count1) &&
        (iVar1 = (pOVar5->header).string_length, size = iVar1 - element_count1,
        element_count1 <= iVar1)) &&
       (bVar3 = Equal(s + size,element_count1,(wchar_t *)locale,element_count1,
                      (ON_Locale *)CONCAT71(in_register_00000009,bIgnoreCase),in_R8B), bVar3)) {
      ON_wString(this);
      CopyToArray(this,size,s);
      return (ON_wString)(wchar_t *)this;
    }
  }
  ON_wString(this,(ON_wString *)suffix);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::RemoveSuffix(
  const wchar_t* suffix,
  const class ON_Locale& locale,
  bool bIgnoreCase
) const
{
  const wchar_t* str = static_cast<const wchar_t*>(*this);
  const int suffix_length = ON_wString::Length(suffix);
  const int str_len = Length();
  if (
    suffix_length > 0
    && str_len >= suffix_length
    && ON_wString::Equal(
      str + (str_len - suffix_length),
      suffix_length,
      suffix,
      suffix_length,
      locale,
      bIgnoreCase)
    )
  {
    ON_wString s;
    s.CopyToArray( str_len - suffix_length, str );
    return s;
  }

  return *this;
}